

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

ssize_t nw_out_writer(void *writer_ctx,uchar *buf,size_t buflen,CURLcode *err)

{
  ssize_t sVar1;
  Curl_easy *data;
  
  if (writer_ctx == (void *)0x0) {
    data = (Curl_easy *)0x0;
  }
  else {
    data = *(Curl_easy **)(*(long *)((long)writer_ctx + 0x10) + 0x10);
  }
  if (data == (Curl_easy *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = Curl_conn_cf_send(*(Curl_cfilter **)((long)writer_ctx + 8),data,buf,buflen,err);
    if ((((0 < sVar1) && (writer_ctx != (void *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
       (0 < *(int *)(*writer_ctx + 0xc))) {
      Curl_trc_cf_infof(data,(Curl_cfilter *)writer_ctx,"[0] egress: wrote %zd bytes",sVar1);
    }
  }
  return sVar1;
}

Assistant:

static ssize_t nw_out_writer(void *writer_ctx,
                             const unsigned char *buf, size_t buflen,
                             CURLcode *err)
{
  struct Curl_cfilter *cf = writer_ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);

  if(data) {
    ssize_t nwritten = Curl_conn_cf_send(cf->next, data,
                                         (const char *)buf, buflen, err);
    if(nwritten > 0)
      CURL_TRC_CF(data, cf, "[0] egress: wrote %zd bytes", nwritten);
    return nwritten;
  }
  return 0;
}